

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  word *pwVar4;
  Reader value;
  Reader value_00;
  Reader *pRVar5;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar6;
  Reader *pRVar7;
  void *pvVar8;
  ListElementCount LVar9;
  Entry *pEVar10;
  RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *pRVar11;
  Entry *pEVar12;
  HashBucket *pHVar13;
  bool bVar14;
  long lVar15;
  size_t sVar16;
  Reader *__begin3;
  SegmentReader *pSVar17;
  long lVar18;
  ElementCount index;
  StringPtr SVar19;
  Vector<capnp::json::Value::Field::Reader> retries;
  Reader field;
  Fault f_1;
  Fault f;
  HashSet<const_void_*> unionsSeen;
  Vector<capnp::json::Value::Field::Reader> local_1c8;
  ElementCount local_19c;
  StructReader local_198;
  undefined4 local_164;
  PointerReader local_160;
  AnnotatedHandler *local_140;
  JsonCodec *local_138;
  CapTableReader *local_130;
  SegmentReader *local_128;
  byte *local_120;
  ListReader local_118;
  SegmentReader *local_e0;
  HashSet<const_void_*> local_d8;
  StructReader local_90;
  StructReader local_60;
  
  local_140 = this;
  local_138 = codec;
  if ((input._reader.dataSize < 0x10) || (*input._reader.data != 5)) {
    local_118.segment = (SegmentReader *)0x0;
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .rows.builder.ptr = (Entry *)0x0;
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .rows.builder.pos =
         (RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_118,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_118);
  }
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .rows.builder.ptr = (Entry *)0x0;
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)0x0;
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .rows.builder.endPtr = (Entry *)0x0;
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .indexes.erasedCount = 0;
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .indexes.buckets.ptr = (HashBucket *)0x0;
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .indexes.buckets.size_ = 0;
  local_d8.
  super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  .indexes.buckets.disposer = (ArrayDisposer *)0x0;
  local_1c8.builder.endPtr = (Reader *)0x0;
  local_1c8.builder.ptr = (Reader *)0x0;
  local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
  if (input._reader.pointerCount == 0) {
    input._reader.nestingLimit = 0x7fffffff;
    input._reader.pointers = (WirePointer *)0x0;
    input._reader.segment = (SegmentReader *)0x0;
    input._reader.capTable = (CapTableReader *)(SegmentReader *)0x0;
  }
  local_198.pointers = (WirePointer *)CONCAT44(local_198.pointers._4_4_,input._reader.nestingLimit);
  local_198.segment = input._reader.segment;
  local_198.capTable = input._reader.capTable;
  local_198.data = input._reader.pointers;
  capnp::_::PointerReader::getList
            (&local_118,(PointerReader *)&local_198,INLINE_COMPOSITE,(word *)0x0);
  LVar9 = local_118.elementCount;
  if (local_118.elementCount != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_198,&local_118,index);
      local_160.capTable = local_198.capTable;
      local_160.pointer = local_198.pointers;
      local_160.segment = local_198.segment;
      local_160.nestingLimit = local_198.nestingLimit;
      if (local_198.pointerCount == 0) {
        local_160.capTable = (CapTableReader *)(SegmentReader *)0x0;
        local_160.pointer = (WirePointer *)0x0;
        local_160.segment = (SegmentReader *)0x0;
        local_160.nestingLimit = 0x7fffffff;
      }
      SVar19.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_160,(void *)0x0,0);
      if (local_198.pointerCount < 2) {
        local_160.nestingLimit = 0x7fffffff;
        local_160.capTable = (CapTableReader *)0x0;
        local_160.pointer = (WirePointer *)0x0;
        local_160.segment = (SegmentReader *)0x0;
      }
      else {
        local_160.pointer = local_198.pointers + 1;
        local_160.capTable = local_198.capTable;
        local_160.segment = local_198.segment;
        local_160.nestingLimit = local_198.nestingLimit;
      }
      capnp::_::PointerReader::getStruct(&local_60,&local_160,(word *)0x0);
      value._reader.capTable = local_60.capTable;
      value._reader.segment = local_60.segment;
      value._reader.data = local_60.data;
      value._reader.pointers = local_60.pointers;
      value._reader.dataSize = local_60.dataSize;
      value._reader.pointerCount = local_60.pointerCount;
      value._reader._38_2_ = local_60._38_2_;
      value._reader.nestingLimit = local_60.nestingLimit;
      value._reader._44_4_ = local_60._44_4_;
      bVar14 = decodeField(local_140,local_138,SVar19,value,output,&local_d8);
      if (!bVar14) {
        if (local_1c8.builder.pos == local_1c8.builder.endPtr) {
          sVar16 = ((long)local_1c8.builder.endPtr - (long)local_1c8.builder.ptr >> 4) *
                   0x5555555555555556;
          if (local_1c8.builder.endPtr == local_1c8.builder.ptr) {
            sVar16 = 4;
          }
          kj::Vector<capnp::json::Value::Field::Reader>::setCapacity(&local_1c8,sVar16);
        }
        *(ReadLimiter **)((long)local_1c8.builder.pos + 0x20) =
             (ReadLimiter *)
             CONCAT26(local_198._38_2_,CONCAT24(local_198.pointerCount,local_198.dataSize));
        ((SegmentReader *)((long)local_1c8.builder.pos + 0x28))->arena =
             (Arena *)CONCAT44(local_198._44_4_,local_198.nestingLimit);
        ((ArrayPtr<const_capnp::word> *)((long)local_1c8.builder.pos + 0x10))->ptr =
             (word *)local_198.data;
        ((ArrayPtr<const_capnp::word> *)((long)local_1c8.builder.pos + 0x10))->size_ =
             (size_t)local_198.pointers;
        ((local_1c8.builder.pos)->_reader).segment = local_198.segment;
        *(CapTableReader **)((long)local_1c8.builder.pos + 8) = local_198.capTable;
        local_1c8.builder.pos =
             (RemoveConst<capnp::json::Value::Field::Reader> *)
             &((SegmentReader *)((long)local_1c8.builder.pos + 0x28))->id;
      }
      index = index + 1;
    } while (LVar9 != index);
  }
  do {
    pRVar6 = local_1c8.builder.pos;
    pSVar17 = (SegmentReader *)local_1c8.builder.ptr;
    if (local_1c8.builder.pos == local_1c8.builder.ptr) break;
    local_198.segment = (SegmentReader *)local_1c8.builder.ptr;
    local_198.capTable = (CapTableReader *)local_1c8.builder.pos;
    local_198.data = local_1c8.builder.endPtr;
    local_198.pointers = (WirePointer *)local_1c8.builder.disposer;
    local_1c8.builder.ptr = (Reader *)0x0;
    local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    local_1c8.builder.endPtr = (Reader *)0x0;
    local_e0 = (SegmentReader *)pRVar6;
    if (pSVar17 != (SegmentReader *)pRVar6) {
      do {
        local_128 = (SegmentReader *)pSVar17->arena;
        local_130 = *(CapTableReader **)&pSVar17->id;
        local_120 = (byte *)(pSVar17->ptr).size_;
        uVar1 = *(ushort *)((long)&pSVar17->readLimiter + 4);
        local_19c = *(ElementCount *)&pSVar17[1].arena;
        local_118.capTable = local_130;
        local_118.ptr = local_120;
        local_118.segment = local_128;
        local_118.elementCount = local_19c;
        if (uVar1 == 0) {
          local_118.capTable = (CapTableReader *)0x0;
          local_118.ptr = (byte *)0x0;
          local_118.segment = (SegmentReader *)0x0;
          local_118.elementCount = 0x7fffffff;
        }
        pwVar4 = (pSVar17->ptr).ptr;
        uVar3 = *(undefined4 *)&pSVar17->readLimiter;
        uVar2 = *(undefined2 *)((long)&pSVar17->readLimiter + 6);
        local_164 = *(undefined4 *)((long)&pSVar17[1].arena + 4);
        SVar19.content =
             (ArrayPtr<const_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_118,(void *)0x0,0);
        if (uVar1 < 2) {
          local_118.elementCount = 0x7fffffff;
          local_118.capTable = (CapTableReader *)0x0;
          local_118.ptr = (byte *)0x0;
          local_118.segment = (SegmentReader *)0x0;
        }
        else {
          local_118.ptr = local_120 + 8;
          local_118.capTable = local_130;
          local_118.segment = local_128;
          local_118.elementCount = local_19c;
        }
        capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_118,(word *)0x0);
        value_00._reader.capTable = local_90.capTable;
        value_00._reader.segment = local_90.segment;
        value_00._reader.data = local_90.data;
        value_00._reader.pointers = local_90.pointers;
        value_00._reader.dataSize = local_90.dataSize;
        value_00._reader.pointerCount = local_90.pointerCount;
        value_00._reader._38_2_ = local_90._38_2_;
        value_00._reader.nestingLimit = local_90.nestingLimit;
        value_00._reader._44_4_ = local_90._44_4_;
        bVar14 = decodeField(local_140,local_138,SVar19,value_00,output,&local_d8);
        if (!bVar14) {
          if (local_1c8.builder.pos == local_1c8.builder.endPtr) {
            sVar16 = ((long)local_1c8.builder.endPtr - (long)local_1c8.builder.ptr >> 4) *
                     0x5555555555555556;
            if (local_1c8.builder.endPtr == local_1c8.builder.ptr) {
              sVar16 = 4;
            }
            kj::Vector<capnp::json::Value::Field::Reader>::setCapacity(&local_1c8,sVar16);
          }
          ((local_1c8.builder.pos)->_reader).segment = local_128;
          *(CapTableReader **)((long)local_1c8.builder.pos + 8) = local_130;
          ((ArrayPtr<const_capnp::word> *)((long)local_1c8.builder.pos + 0x10))->ptr = pwVar4;
          ((ArrayPtr<const_capnp::word> *)((long)local_1c8.builder.pos + 0x10))->size_ =
               (size_t)local_120;
          *(undefined4 *)((long)local_1c8.builder.pos + 0x20) = uVar3;
          *(ushort *)((long)((long)local_1c8.builder.pos + 0x20) + 4) = uVar1;
          *(undefined2 *)((long)((long)local_1c8.builder.pos + 0x20) + 6) = uVar2;
          *(ElementCount *)&((SegmentReader *)((long)local_1c8.builder.pos + 0x28))->arena =
               local_19c;
          *(undefined4 *)((long)&((SegmentReader *)((long)local_1c8.builder.pos + 0x28))->arena + 4)
               = local_164;
          local_1c8.builder.pos =
               (RemoveConst<capnp::json::Value::Field::Reader> *)
               &((SegmentReader *)((long)local_1c8.builder.pos + 0x28))->id;
        }
        pSVar17 = (SegmentReader *)&pSVar17[1].id;
      } while (pSVar17 != local_e0);
    }
    pvVar8 = local_198.data;
    pSVar17 = local_198.segment;
    lVar15 = (long)local_1c8.builder.pos - (long)local_1c8.builder.ptr;
    lVar18 = (long)local_198.capTable - (long)local_198.segment;
    if (local_198.segment != (SegmentReader *)0x0) {
      local_198.segment = (SegmentReader *)0x0;
      local_198.capTable = (CapTableReader *)0x0;
      local_198.data = (SegmentReader *)0x0;
      (**(code **)*local_198.pointers)
                (local_198.pointers,pSVar17,0x30,(lVar18 >> 4) * -0x5555555555555555,
                 ((long)pvVar8 - (long)pSVar17 >> 4) * -0x5555555555555555,0);
    }
  } while (lVar15 != lVar18);
  pRVar7 = local_1c8.builder.endPtr;
  pRVar6 = local_1c8.builder.pos;
  pRVar5 = local_1c8.builder.ptr;
  if ((SegmentReader *)local_1c8.builder.ptr != (SegmentReader *)0x0) {
    local_1c8.builder.ptr = (Reader *)0x0;
    local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    local_1c8.builder.endPtr = (Reader *)0x0;
    (**(code **)*(WirePointer *)local_1c8.builder.disposer)
              (local_1c8.builder.disposer,pRVar5,0x30,
               ((long)pRVar6 - (long)pRVar5 >> 4) * -0x5555555555555555,
               ((long)pRVar7 - (long)pRVar5 >> 4) * -0x5555555555555555,0);
  }
  sVar16 = local_d8.
           super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
           .indexes.buckets.size_;
  pHVar13 = local_d8.
            super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
            .indexes.buckets.ptr;
  if (local_d8.
      super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
      .indexes.buckets.ptr != (HashBucket *)0x0) {
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .indexes.buckets.ptr = (HashBucket *)0x0;
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .indexes.buckets.size_ = 0;
    (**(local_d8.
        super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
        .indexes.buckets.disposer)->_vptr_ArrayDisposer)
              (local_d8.
               super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
               .indexes.buckets.disposer,pHVar13,8,sVar16,sVar16,0);
  }
  pEVar12 = local_d8.
            super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
            .rows.builder.endPtr;
  pRVar11 = local_d8.
            super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
            .rows.builder.pos;
  pEVar10 = local_d8.
            super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
            .rows.builder.ptr;
  if (local_d8.
      super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
      .rows.builder.ptr != (Entry *)0x0) {
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .rows.builder.ptr = (Entry *)0x0;
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .rows.builder.pos =
         (RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)0x0;
    local_d8.
    super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
    .rows.builder.endPtr = (Entry *)0x0;
    (**(local_d8.
        super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
        .rows.builder.disposer)->_vptr_ArrayDisposer)
              (local_d8.
               super_Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
               .rows.builder.disposer,pEVar10,8,(long)pRVar11 - (long)pEVar10 >> 3,
               (long)pEVar12 - (long)pEVar10 >> 3,0);
  }
  return;
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }